

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::Curve::writeTo(Curve *this,BinaryWriter *binary)

{
  Shape::writeTo(&this->super_Shape,binary);
  BinaryWriter::write<float>(binary,&this->width0);
  BinaryWriter::write<float>(binary,&this->width1);
  BinaryWriter::write<pbrt::Curve::BasisType>(binary,&this->basis);
  BinaryWriter::write<pbrt::Curve::CurveType>(binary,&this->type);
  BinaryWriter::write<unsigned_char>(binary,&this->degree);
  BinaryWriter::write<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>,void>(binary,&this->P);
  BinaryWriter::write<pbrt::math::affine3f>(binary,&this->transform);
  return 0x36;
}

Assistant:

int Curve::writeTo(BinaryWriter &binary) 
  {
    Shape::writeTo(binary);
    binary.write(width0);
    binary.write(width1);
    binary.write(basis);
    binary.write(type);
    binary.write(degree);
    binary.write(P);
    binary.write(transform);
    return TYPE_CURVE;
  }